

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O3

Sets * __thiscall wasm::LocalGraph::getSets(LocalGraph *this,LocalGet *get)

{
  const_iterator cVar1;
  Sets *local_20;
  LocalGet *local_18;
  LocalGet *get_local;
  
  local_18 = get;
  cVar1 = std::
          _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->getSetsMap)._M_h,&local_18);
  if (cVar1.
      super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (getSets(wasm::LocalGet*)::empty == '\0') {
      getSets();
    }
    else {
      local_20 = &getSets::empty;
    }
  }
  else {
    local_20 = (Sets *)((long)cVar1.
                              super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
                              ._M_cur + 0x10);
  }
  return local_20;
}

Assistant:

const Sets& getSets(LocalGet* get) const {
    auto iter = getSetsMap.find(get);
    if (iter == getSetsMap.end()) {
      // A missing entry means there is nothing there (and we saved a little
      // space by not putting something there).
      //
      // Use a canonical constant empty set to avoid allocation.
      static const Sets empty;
      return empty;
    }
    return iter->second;
  }